

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::AddForcedSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  VType *pVVar1;
  ulong uVar2;
  __normal_iterator<Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  _Var3;
  Vector3<double> *pVVar4;
  long lVar5;
  pointer pVVar6;
  ulong uVar7;
  pointer pVVar8;
  PointData local_50;
  
  pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar8 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar6 != pVVar8) {
    uVar2 = ((long)pVVar8 - (long)pVVar6 >> 3) * -0x5555555555555555;
    lVar5 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar6,pVVar8,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar6,pVVar8);
    pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar8 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  _Var3 = std::
          __unique<__gnu_cxx::__normal_iterator<Vector3<double>*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (pVVar6,pVVar8);
  pVVar4 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (_Var3._M_current !=
      (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = _Var3._M_current;
  }
  if (_Var3._M_current == pVVar4) {
    uVar2 = ((long)_Var3._M_current - (long)pVVar4 >> 3) * -0x5555555555555555;
  }
  else {
    lVar5 = 0;
    uVar7 = 0;
    do {
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.super__Tuple_impl<1UL,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = SUB84(uVar7,0);
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] =
           *(VType *)((long)pVVar4->c_ + lVar5 + 0x10);
      pVVar1 = (VType *)((long)pVVar4->c_ + lVar5);
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] = *pVVar1;
      local_50.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
      super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] = pVVar1[1];
      S2PointIndex<int>::Add(site_index,&local_50);
      uVar7 = uVar7 + 1;
      pVVar4 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->sites_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pVVar4 >> 3) * -0x5555555555555555;
      lVar5 = lVar5 + 0x18;
    } while (uVar7 <= uVar2 && uVar2 - uVar7 != 0);
  }
  this->num_forced_sites_ = (SiteId)uVar2;
  return;
}

Assistant:

void S2Builder::AddForcedSites(S2PointIndex<SiteId>* site_index) {
  // Sort the forced sites and remove duplicates.
  std::sort(sites_.begin(), sites_.end());
  sites_.erase(std::unique(sites_.begin(), sites_.end()), sites_.end());
  // Add the forced sites to the index.
  for (SiteId id = 0; id < sites_.size(); ++id) {
    site_index->Add(sites_[id], id);
  }
  num_forced_sites_ = sites_.size();
}